

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

string * stringformat<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
                   (string *__return_storage_ptr__,char *fmt,
                   vector<unsigned_char,_std::allocator<unsigned_char>_> *args)

{
  StringFormatter<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> local_1b8;
  stringstream local_1a8 [8];
  stringstream buf;
  ostream local_198 [376];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *args_local;
  char *fmt_local;
  
  local_20 = args;
  args_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)fmt;
  fmt_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  StringFormatter<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>::
  StringFormatter(&local_1b8,(char *)args_local,local_20);
  operator<<(local_198,&local_1b8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string stringformat(const char *fmt, ARGS&&...args)
{
    std::stringstream buf;
    buf << StringFormatter<ARGS...>(fmt, std::forward<ARGS>(args)...);

    return buf.str();
}